

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_server2.c
# Opt level: O0

int get_auth_mode(char *s)

{
  int iVar1;
  char *s_local;
  
  iVar1 = strcmp(s,"none");
  if (iVar1 == 0) {
    s_local._4_4_ = 0;
  }
  else {
    iVar1 = strcmp(s,"optional");
    if (iVar1 == 0) {
      s_local._4_4_ = 1;
    }
    else {
      iVar1 = strcmp(s,"required");
      if (iVar1 == 0) {
        s_local._4_4_ = 2;
      }
      else {
        s_local._4_4_ = -1;
      }
    }
  }
  return s_local._4_4_;
}

Assistant:

static int get_auth_mode( const char *s )
{
    if( strcmp( s, "none" ) == 0 )
        return( MBEDTLS_SSL_VERIFY_NONE );
    if( strcmp( s, "optional" ) == 0 )
        return( MBEDTLS_SSL_VERIFY_OPTIONAL );
    if( strcmp( s, "required" ) == 0 )
        return( MBEDTLS_SSL_VERIFY_REQUIRED );

    return( -1 );
}